

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>>::
emplace<QModelIndex&,QSortFilterProxyModelPrivate::Mapping*&>
          (QMovableArrayOps<std::pair<QModelIndex,QSortFilterProxyModelPrivate::Mapping*>> *this,
          qsizetype i,QModelIndex *args,Mapping **args_1)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  quintptr qVar4;
  QAbstractItemModel *pQVar5;
  long lVar6;
  Mapping *pMVar7;
  long lVar8;
  
  piVar3 = *(int **)this;
  if ((piVar3 == (int *)0x0) || (1 < *piVar3)) {
LAB_0049b1bb:
    iVar1 = args->r;
    iVar2 = args->c;
    qVar4 = args->i;
    pQVar5 = (args->m).ptr;
    pMVar7 = *args_1;
    lVar6 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>::
    detachAndGrow((QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                   *)this,(uint)(i == 0 && lVar6 != 0),1,
                  (pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*> **)0x0,
                  (QArrayDataPointer<std::pair<QModelIndex,_QSortFilterProxyModelPrivate::Mapping_*>_>
                   *)0x0);
    lVar8 = *(long *)(this + 8);
    if (i != 0 || lVar6 == 0) {
      piVar3 = (int *)(lVar8 + i * 0x20);
      memmove(piVar3 + 8,(void *)(lVar8 + i * 0x20),(*(long *)(this + 0x10) - i) * 0x20);
      *piVar3 = iVar1;
      piVar3[1] = iVar2;
      *(quintptr *)(piVar3 + 2) = qVar4;
      *(QAbstractItemModel **)(piVar3 + 4) = pQVar5;
      *(Mapping **)(piVar3 + 6) = pMVar7;
      goto LAB_0049b280;
    }
    *(int *)(lVar8 + -0x20) = iVar1;
    *(int *)(lVar8 + -0x1c) = iVar2;
    *(quintptr *)(lVar8 + -0x18) = qVar4;
    *(QAbstractItemModel **)(lVar8 + -0x10) = pQVar5;
  }
  else {
    lVar8 = *(long *)(this + 0x10);
    if ((lVar8 == i && piVar3 != (int *)0x0) &&
       (*(long *)(piVar3 + 2) !=
        ((long)(*(long *)(this + 8) - ((long)piVar3 + 0x1fU & 0xfffffffffffffff0)) >> 5) + lVar8)) {
      lVar6 = *(long *)(this + 8);
      lVar8 = lVar8 * 0x20;
      *(QAbstractItemModel **)(lVar6 + 0x10 + lVar8) = (args->m).ptr;
      qVar4 = args->i;
      *(undefined8 *)(lVar6 + lVar8) = *(undefined8 *)args;
      ((undefined8 *)(lVar6 + lVar8))[1] = qVar4;
      *(Mapping **)(lVar6 + 0x18 + lVar8) = *args_1;
      goto LAB_0049b280;
    }
    if (((i != 0) || (piVar3 == (int *)0x0)) ||
       (((long)piVar3 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_0049b1bb;
    lVar8 = *(long *)(this + 8);
    *(QAbstractItemModel **)(lVar8 + -0x10) = (args->m).ptr;
    qVar4 = args->i;
    *(undefined8 *)(lVar8 + -0x20) = *(undefined8 *)args;
    *(quintptr *)(lVar8 + -0x18) = qVar4;
    pMVar7 = *args_1;
  }
  *(Mapping **)(lVar8 + -8) = pMVar7;
  *(long *)(this + 8) = *(long *)(this + 8) + -0x20;
LAB_0049b280:
  *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }